

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

size_t mtbdd_nodecount_mark(MTBDD mtbdd)

{
  int iVar1;
  mtbddnode_t n_00;
  uint64_t uVar2;
  size_t sVar3;
  size_t sVar4;
  mtbddnode_t n;
  MTBDD mtbdd_local;
  
  n_00 = MTBDD_GETNODE(mtbdd);
  iVar1 = mtbddnode_getmark(n_00);
  if (iVar1 == 0) {
    mtbddnode_setmark(n_00,1);
    iVar1 = mtbddnode_isleaf(n_00);
    if (iVar1 == 0) {
      uVar2 = mtbddnode_getlow(n_00);
      sVar3 = mtbdd_nodecount_mark(uVar2);
      uVar2 = mtbddnode_gethigh(n_00);
      sVar4 = mtbdd_nodecount_mark(uVar2);
      mtbdd_local = sVar3 + 1 + sVar4;
    }
    else {
      mtbdd_local = 1;
    }
  }
  else {
    mtbdd_local = 0;
  }
  return mtbdd_local;
}

Assistant:

static size_t
mtbdd_nodecount_mark(MTBDD mtbdd)
{
    mtbddnode_t n = MTBDD_GETNODE(mtbdd);
    if (mtbddnode_getmark(n)) return 0;
    mtbddnode_setmark(n, 1);
    if (mtbddnode_isleaf(n)) return 1; // count leaf as 1
    return 1 + mtbdd_nodecount_mark(mtbddnode_getlow(n)) + mtbdd_nodecount_mark(mtbddnode_gethigh(n));
}